

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O2

bid_t filemgr_alloc_multiple_cond
                (filemgr *file,bid_t nextbid,int nblock,bid_t *begin,bid_t *end,
                err_log_callback *log_callback)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ssize_t sVar4;
  uint8_t _buf;
  int local_3c;
  err_log_callback *local_38;
  
  local_3c = nblock;
  local_38 = log_callback;
  pthread_spin_lock(&file->lock);
  uVar2 = (file->pos).super___atomic_base<unsigned_long>._M_i / (ulong)file->blocksize;
  if (uVar2 == nextbid) {
    uVar1 = file->blocksize;
    uVar3 = (file->pos).super___atomic_base<unsigned_long>._M_i / (ulong)uVar1;
    *begin = uVar3;
    *end = (uVar3 + (long)local_3c) - 1;
    atomic_add_uint64_t(&file->pos,(ulong)(local_3c * uVar1),memory_order_seq_cst);
    if (global_config.ncacheblock < 1) {
      _buf = '\0';
      sVar4 = (*file->ops->pwrite)
                        (file->fd,&_buf,1,(file->pos).super___atomic_base<unsigned_long>._M_i);
      _log_errno_str(file->ops,local_38,(fdb_status)sVar4,"WRITE",file->filename);
    }
  }
  else {
    *begin = 0xffffffffffffffff;
    *end = 0xffffffffffffffff;
  }
  pthread_spin_unlock(&file->lock);
  return uVar2;
}

Assistant:

bid_t filemgr_alloc_multiple_cond(struct filemgr *file, bid_t nextbid, int nblock,
                                  bid_t *begin, bid_t *end,
                                  err_log_callback *log_callback)
{
    bid_t bid;
    spin_lock(&file->lock);
    bid = atomic_get_uint64_t(&file->pos) / file->blocksize;
    if (bid == nextbid) {
        *begin = atomic_get_uint64_t(&file->pos) / file->blocksize;
        *end = *begin + nblock - 1;
        atomic_add_uint64_t(&file->pos, file->blocksize * nblock);

        if (global_config.ncacheblock <= 0) {
            // if block cache is turned off, write the allocated block before use
            uint8_t _buf = 0x0;
            ssize_t rv = file->ops->pwrite(file->fd, &_buf, 1,
                                           atomic_get_uint64_t(&file->pos));
            _log_errno_str(file->ops, log_callback, (fdb_status) rv, "WRITE", file->filename);
        }
    }else{
        *begin = BLK_NOT_FOUND;
        *end = BLK_NOT_FOUND;
    }
    spin_unlock(&file->lock);
    return bid;
}